

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::as_utf8_end(char *buffer,size_t size,wchar_t *str,size_t length)

{
  value_type puVar1;
  uint8_t *end;
  uint8_t *begin;
  size_t length_local;
  wchar_t *str_local;
  size_t size_local;
  char *buffer_local;
  
  puVar1 = wchar_decoder::process<pugi::impl::(anonymous_namespace)::utf8_writer>(str,length,buffer)
  ;
  if ((value_type)(buffer + size) == puVar1) {
    return;
  }
  __assert_fail("begin + size == end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                ,0x8f4,
                "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
               );
}

Assistant:

PUGI__FN void as_utf8_end(char* buffer, size_t size, const wchar_t* str, size_t length)
	{
		// convert to utf8
		uint8_t* begin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* end = wchar_decoder::process(str, length, begin, utf8_writer());

		assert(begin + size == end);
		(void)!end;
		(void)!size;
	}